

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution-graph.hxx
# Opt level: O2

void __thiscall lineage::SolutionGraph::save(SolutionGraph *this,string *fileNamePrefix)

{
  pointer pvVar1;
  pointer puVar2;
  ostream *poVar3;
  pointer pVVar4;
  size_t v;
  ulong uVar5;
  unsigned_long *v_1;
  long lVar6;
  pointer puVar7;
  size_t j;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string *local_240;
  ulong local_238;
  ofstream file;
  
  std::operator+(&local_260,fileNamePrefix,"-fragment-node-labels.txt");
  std::ofstream::ofstream(&file,(string *)&local_260,_S_out);
  std::__cxx11::string::~string((string *)&local_260);
  lVar6 = 0;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->cellOfNode_).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->cellOfNode_).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&file,
                        *(int *)((long)(this->problemGraph_->problem_->nodes).
                                       super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar6));
    poVar3 = std::operator<<(poVar3,'\t');
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar3,
                        *(int *)((long)(this->problemGraph_->problem_->nodes).
                                       super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 4 + lVar6));
    poVar3 = std::operator<<(poVar3,'\t');
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar6 = lVar6 + 0x18;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 fileNamePrefix,"-fragment-edge-labels.txt");
  saveSolution((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
               this->solution_);
  std::__cxx11::string::~string((string *)&file);
  local_240 = fileNamePrefix;
  std::operator+(&local_260,fileNamePrefix,"-cell-nodes.txt");
  std::ofstream::ofstream(&file,(string *)&local_260,_S_out);
  std::__cxx11::string::~string((string *)&local_260);
  uVar5 = 0;
  while (uVar5 < (ulong)((long)(this->lineageGraph_).vertices_.
                               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->lineageGraph_).vertices_.
                               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 6)) {
    pvVar1 = (this->nodesOfCell_).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = *(pointer *)
              ((long)&pvVar1[uVar5].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 8);
    local_238 = uVar5;
    for (puVar7 = pvVar1[uVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1) {
      poVar3 = std::operator<<((ostream *)&file,"(");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar3,
                          *(int *)((long)(this->problemGraph_->problem_->nodes).
                                         super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                         ._M_impl.super__Vector_impl_data._M_start + *puVar7 * 0x18)
                         );
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar3,
                          *(int *)((long)(this->problemGraph_->problem_->nodes).
                                         super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4 +
                                  *puVar7 * 0x18));
      std::operator<<(poVar3,") ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&file);
    uVar5 = local_238 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  std::operator+(&local_260,local_240,"-cell-edges.txt");
  std::ofstream::ofstream(&file,(string *)&local_260,_S_out);
  std::__cxx11::string::~string((string *)&local_260);
  pVVar4 = (this->lineageGraph_).vertices_.
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->lineageGraph_).vertices_.
                            super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 6);
      uVar5 = uVar5 + 1) {
    for (uVar8 = 0;
        uVar8 < (ulong)((long)*(pointer *)((long)&pVVar4[uVar5].to_.vector_ + 8) -
                        *(long *)&pVVar4[uVar5].to_.vector_.
                                  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       >> 4); uVar8 = uVar8 + 1) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
      poVar3 = std::operator<<(poVar3,'\t');
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      pVVar4 = (this->lineageGraph_).vertices_.
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void save(std::string const& fileNamePrefix = "lineage") const
    {
        {
            std::ofstream file(fileNamePrefix + "-fragment-node-labels.txt");
            for (size_t v = 0; v < numberOfNodes(); ++v)
                file << problem().nodes[v].t
                    << '\t' << problem().nodes[v].id
                    << '\t' << cellOfNode(v)
                    << std::endl;
            
            file.close();
        }

        saveSolution(fileNamePrefix + "-fragment-edge-labels.txt", solution_);

        {
            std::ofstream file(fileNamePrefix + "-cell-nodes.txt");
            for(size_t c = 0; c < numberOfCells(); ++c)
            {
                for(auto& v: nodesOfCell_[c])
                    file << "(" << problem().nodes[v].t
                        << " " << problem().nodes[v].id
                        << ") ";
                
                file << std::endl;
            }

            file.close();
        }
        {
            std::ofstream file(fileNamePrefix + "-cell-edges.txt");
            for(size_t c = 0; c < numberOfCells(); ++c)
                for(size_t j = 0; j < lineageGraph_.numberOfEdgesFromVertex(c); ++j)
                    file << c << '\t' << lineageGraph_.vertexFromVertex(c, j) << std::endl;

            file.close();
        }
    }